

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poll.c
# Opt level: O1

int nn_poll(nn_pollfd *fds,int nfds,int timeout)

{
  int iVar1;
  int extraout_EAX;
  pollfd *__fds;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  int fd;
  size_t sz;
  int local_44;
  size_t local_40;
  int local_38;
  int local_34;
  
  __fds = (pollfd *)nn_alloc_((long)nfds << 4);
  if (__fds == (pollfd *)0x0) {
LAB_0011fd4f:
    nn_poll_cold_4();
    iVar1 = extraout_EAX;
  }
  else {
    uVar4 = 0;
    uVar3 = (ulong)(uint)nfds;
    if (nfds != 0) {
      uVar5 = 0;
      local_38 = timeout;
      local_34 = nfds;
      do {
        if ((fds[uVar5].events & 1) != 0) {
          local_40 = 4;
          iVar1 = nn_getsockopt(fds[uVar5].fd,0,0xb,&local_44,&local_40);
          if (iVar1 < 0) goto LAB_0011fd35;
          if (local_40 == 4) {
            iVar1 = (int)uVar4;
            __fds[iVar1].fd = local_44;
            __fds[iVar1].events = 1;
            uVar4 = (ulong)(iVar1 + 1);
            goto LAB_0011fc37;
          }
          nn_poll_cold_1();
LAB_0011fd4a:
          nn_poll_cold_2();
          goto LAB_0011fd4f;
        }
LAB_0011fc37:
        if ((fds[uVar5].events & 2) != 0) {
          local_40 = 4;
          iVar1 = nn_getsockopt(fds[uVar5].fd,0,10,&local_44,&local_40);
          if (iVar1 < 0) {
LAB_0011fd35:
            nn_free(__fds);
            return -1;
          }
          if (local_40 != 4) goto LAB_0011fd4a;
          iVar1 = (int)uVar4;
          __fds[iVar1].fd = local_44;
          __fds[iVar1].events = 1;
          uVar4 = (ulong)(iVar1 + 1);
        }
        uVar5 = uVar5 + 1;
      } while (uVar3 != uVar5);
      uVar4 = (ulong)(int)uVar4;
      timeout = local_38;
      nfds = local_34;
    }
    iVar1 = poll(__fds,uVar4,timeout);
    if (0 < iVar1) {
      if (nfds == 0) {
        iVar1 = 0;
      }
      else {
        uVar4 = 0;
        iVar1 = 0;
        iVar2 = 0;
        do {
          fds[uVar4].revents = 0;
          if ((fds[uVar4].events & 1U) != 0) {
            if ((__fds[iVar2].revents & 1) != 0) {
              fds[uVar4].revents = 1;
            }
            iVar2 = iVar2 + 1;
          }
          if ((fds[uVar4].events & 2U) != 0) {
            if ((__fds[iVar2].revents & 1) != 0) {
              *(byte *)&fds[uVar4].revents = (byte)fds[uVar4].revents | 2;
            }
            iVar2 = iVar2 + 1;
          }
          iVar1 = (iVar1 + 1) - (uint)(fds[uVar4].revents == 0);
          uVar4 = uVar4 + 1;
        } while (uVar3 != uVar4);
      }
      nn_free(__fds);
      return iVar1;
    }
  }
  nn_poll_cold_3();
  return iVar1;
}

Assistant:

int nn_poll (struct nn_pollfd *fds, int nfds, int timeout)
{
    int rc;
    int i;
    int pos;
    int fd;
    int res;
    size_t sz;
    struct pollfd *pfd;

    /*  Construct a pollset to be used with OS-level 'poll' function. */
    pfd = nn_alloc (sizeof (struct pollfd) * nfds * 2, "pollset");
    alloc_assert (pfd);
    pos = 0;
    for (i = 0; i != nfds; ++i) {
        if (fds [i].events & NN_POLLIN) {
            sz = sizeof (fd);
            rc = nn_getsockopt (fds [i].fd, NN_SOL_SOCKET, NN_RCVFD, &fd, &sz);
            if (nn_slow (rc < 0)) {
                nn_free (pfd);
                return -1;
            }
            nn_assert (sz == sizeof (fd));
            pfd [pos].fd = fd;
            pfd [pos].events = POLLIN;
            ++pos;
        }
        if (fds [i].events & NN_POLLOUT) {
            sz = sizeof (fd);
            rc = nn_getsockopt (fds [i].fd, NN_SOL_SOCKET, NN_SNDFD, &fd, &sz);
            if (nn_slow (rc < 0)) {
                nn_free (pfd);
                return -1;
            }
            nn_assert (sz == sizeof (fd));
            pfd [pos].fd = fd;
            pfd [pos].events = POLLIN;
            ++pos;
        }
    }    

    /*  Do the polling itself. */
    rc = poll (pfd, pos, timeout);
    if (nn_slow (rc <= 0)) {
        res = errno;
        nn_free (pfd);
        errno = res;
        return rc;
    }

    /*  Move the results from OS-level poll to nn_poll's pollset. */
    res = 0;
    pos = 0;
    for (i = 0; i != nfds; ++i) {
        fds [i].revents = 0;
        if (fds [i].events & NN_POLLIN) {
            if (pfd [pos].revents & POLLIN)
                fds [i].revents |= NN_POLLIN;
            ++pos;
        }
        if (fds [i].events & NN_POLLOUT) {
            if (pfd [pos].revents & POLLIN)
                fds [i].revents |= NN_POLLOUT;
            ++pos;
        }
        if (fds [i].revents)
            ++res;
    }

    nn_free (pfd);
    return res;
}